

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagate_join.cpp
# Opt level: O3

void __thiscall
duckdb::StatisticsPropagator::PropagateStatistics
          (StatisticsPropagator *this,LogicalComparisonJoin *join,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *node_ptr)

{
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *this_00;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_01;
  byte bVar1;
  char cVar2;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> *puVar3;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> *puVar4;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var5;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var6;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var7;
  __uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> _Var8;
  undefined8 uVar9;
  bool bVar10;
  bool bVar11;
  FilterPropagateResult FVar12;
  int iVar13;
  reference this_02;
  pointer pBVar14;
  type pBVar15;
  type pBVar16;
  data_t adVar17 [8];
  type left;
  type right;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> uVar18;
  pointer pEVar19;
  reference pvVar20;
  __uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> *p_Var21;
  reference pvVar22;
  LogicalLimit *this_03;
  pointer pLVar23;
  size_type __n;
  size_type __n_00;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> _Var24;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> *this_04;
  undefined1 auVar25 [16];
  undefined1 local_120 [16];
  optional_ptr<duckdb::LogicalOperator,_true> local_110;
  undefined1 local_108 [16];
  __node_base local_f8;
  _Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_> _Stack_f0;
  undefined1 local_e0 [16];
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> local_d0;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> local_c8;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> local_c0;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> local_b8;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_b0;
  undefined1 local_a8 [24];
  _Head_base<0UL,_duckdb::Expression_*,_false> _Stack_90;
  __node_base local_80;
  reference local_78;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> local_70;
  ClientContext *pCStack_68;
  LogicalOperator *local_60;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Stack_58;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> local_50;
  ClientContext *pCStack_48;
  _Hash_node_base *local_40;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Stack_38;
  
  if ((join->conditions).super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
      .super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (join->conditions).super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
      .super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_80._M_nxt = (_Hash_node_base *)&join->conditions;
    local_b8._M_head_impl = (BaseStatistics *)&(join->super_LogicalJoin).join_stats;
    this_00 = &(join->super_LogicalJoin).super_LogicalOperator.children;
    __n = 0;
    local_e0._0_8_ = node_ptr;
    do {
      this_02 = vector<duckdb::JoinCondition,_true>::operator[]
                          ((vector<duckdb::JoinCondition,_true> *)local_80._M_nxt,__n);
      PropagateExpression((StatisticsPropagator *)(local_120 + 8),
                          (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)this);
      this_01 = &this_02->right;
      PropagateExpression((StatisticsPropagator *)local_120,
                          (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)this);
      if (((ClientContext *)local_120._8_8_ == (ClientContext *)0x0) ||
         ((Optimizer *)local_120._0_8_ == (Optimizer *)0x0)) goto switchD_0175a8cd_caseD_4;
      if ((this_02->comparison == COMPARE_BOUNDARY_END) ||
         (this_02->comparison == COMPARE_DISTINCT_FROM)) {
        pBVar14 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  ::operator->((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                                *)(local_120 + 8));
        bVar10 = BaseStatistics::CanHaveNull(pBVar14);
        if (!bVar10) goto LAB_0175a7d9;
        pBVar14 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  ::operator->((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                                *)local_120);
        bVar11 = BaseStatistics::CanHaveNull(pBVar14);
        bVar10 = false;
        if (!bVar11) goto LAB_0175a7d9;
        goto LAB_0175af6c;
      }
LAB_0175a7d9:
      pBVar15 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                ::operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                             *)(local_120 + 8));
      pBVar16 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                ::operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                             *)local_120);
      FVar12 = PropagateComparison(this,pBVar15,pBVar16,this_02->comparison);
      unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
      operator->((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  *)(local_120 + 8));
      BaseStatistics::ToUnique((BaseStatistics *)local_108);
      ::std::
      vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>
                ((vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
                  *)local_b8._M_head_impl,
                 (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  *)local_108);
      uVar9 = local_108._0_8_;
      if ((__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
          local_108._0_8_ !=
          (__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)0x0
         ) {
        BaseStatistics::~BaseStatistics((BaseStatistics *)local_108._0_8_);
        operator_delete((void *)uVar9);
      }
      unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
      operator->((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  *)local_120);
      BaseStatistics::ToUnique((BaseStatistics *)local_108);
      ::std::
      vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>
                ((vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
                  *)local_b8._M_head_impl,
                 (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  *)local_108);
      uVar9 = local_108._0_8_;
      if ((BaseStatistics *)local_108._0_8_ != (BaseStatistics *)0x0) {
        BaseStatistics::~BaseStatistics((BaseStatistics *)local_108._0_8_);
        operator_delete((void *)uVar9);
      }
      adVar17 = (data_t  [8])local_e0._0_8_;
      if (FVar12 != FILTER_ALWAYS_TRUE) {
        if ((FVar12 == FILTER_ALWAYS_FALSE) || (FVar12 == FILTER_FALSE_OR_NULL)) {
          bVar1 = (join->super_LogicalJoin).super_LogicalOperator.field_0x61;
          __n_00 = (size_type)bVar1;
          switch(bVar1) {
          case 2:
            __n_00 = 0;
          case 1:
            adVar17 = (data_t  [8])
                      vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                      ::operator[](this_00,__n_00);
          case 3:
          case 5:
          case 9:
switchD_0175a8cd_caseD_3:
            bVar10 = true;
            ReplaceWithEmptyResult
                      (this,(unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                             *)adVar17);
            break;
          default:
            goto switchD_0175a8cd_caseD_4;
          case 10:
            pvVar20 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                      ::operator[](this_00,0);
            pvVar22 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                      ::operator[](this_00,1);
            _Var5._M_head_impl =
                 (pvVar20->
                 super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
            (pvVar20->
            super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
                 (LogicalOperator *)0x0;
            _Var6._M_head_impl =
                 (pvVar22->
                 super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
            (pvVar22->
            super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
                 (LogicalOperator *)0x0;
            _Var7._M_head_impl =
                 (pvVar20->
                 super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
            (pvVar20->
            super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
                 _Var6._M_head_impl;
            if (_Var7._M_head_impl != (LogicalOperator *)0x0) {
              (**(code **)((long)(_Var7._M_head_impl)->_vptr_LogicalOperator + 8))();
            }
            _Var6._M_head_impl =
                 (pvVar22->
                 super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
            (pvVar22->
            super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
                 _Var5._M_head_impl;
            if (_Var6._M_head_impl != (LogicalOperator *)0x0) {
              (**(code **)((long)(_Var6._M_head_impl)->_vptr_LogicalOperator + 8))();
            }
          case 6:
            pvVar20 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                      ::operator[](this_00,0);
            _Var5._M_head_impl =
                 (pvVar20->
                 super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
            (pvVar20->
            super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
                 (LogicalOperator *)0x0;
            _Var8._M_t.
            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
                 *(tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_> *
                  )local_e0._0_8_;
            *(LogicalOperator **)local_e0._0_8_ = _Var5._M_head_impl;
            bVar10 = true;
            if (_Var8._M_t.
                super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
                (_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 )0x0) {
              (**(code **)(*(long *)_Var8._M_t.
                                    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                                    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                    _M_head_impl + 8))();
            }
          }
        }
        else {
switchD_0175a8cd_caseD_4:
          bVar10 = false;
          if ((this_02->comparison != COMPARE_DISTINCT_FROM) &&
             (this_02->comparison != COMPARE_BOUNDARY_END)) {
            cVar2 = (join->super_LogicalJoin).super_LogicalOperator.field_0x61;
            bVar10 = false;
            if ((cVar2 == '\x05') || (cVar2 == '\x03')) {
              left = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                     operator*(&this_02->left);
              right = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      ::operator*(this_01);
              UpdateFilterStatistics(this,left,right,this_02->comparison);
              PropagateExpression((StatisticsPropagator *)local_108,
                                  (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                   *)this);
              uVar18 = PropagateExpression((StatisticsPropagator *)local_a8,
                                           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                            *)this);
              auVar25._0_4_ = -(uint)(SUB84(local_120._8_8_,4) == 0 && (int)local_120._8_8_ == 0);
              auVar25._4_4_ = -(uint)((int)local_120._0_8_ == 0 && SUB84(local_120._0_8_,4) == 0);
              auVar25._8_4_ = -(uint)(SUB84(local_108._0_8_,4) == 0 && (int)local_108._0_8_ == 0);
              auVar25._12_4_ = -(uint)((int)local_a8._0_8_ == 0 && SUB84(local_a8._0_8_,4) == 0);
              iVar13 = movmskps((int)uVar18.
                                     super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                                     ._M_t.
                                     super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
                                     .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>.
                                     _M_head_impl,auVar25);
              if (((iVar13 == 0) &&
                  (pEVar19 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                             ::operator->(&this_02->left),
                  (pEVar19->super_BaseExpression).type == BOUND_COLUMN_REF)) &&
                 (pEVar19 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            ::operator->(this_01),
                 (pEVar19->super_BaseExpression).type == BOUND_COLUMN_REF)) {
                local_78 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                           ::operator[](this_00,0);
                pBVar15 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                          ::operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                                       *)(local_120 + 8));
                pBVar16 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                          ::operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                                       *)local_108);
                CreateFilterFromJoinStats(this,local_78,&this_02->left,pBVar15,pBVar16);
                pvVar20 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                          ::operator[](this_00,1);
                pBVar15 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                          ::operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                                       *)local_120);
                pBVar16 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                          ::operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                                       *)local_a8);
                CreateFilterFromJoinStats(this,pvVar20,this_01,pBVar15,pBVar16);
              }
              if ((long)(join->super_LogicalJoin).join_stats.
                        super_vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(join->super_LogicalJoin).join_stats.
                        super_vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start == 0x10) {
                p_Var21 = (__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                           *)vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
                             ::operator[]((vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
                                           *)local_b8._M_head_impl,0);
                uVar9 = local_108._0_8_;
                local_108._0_8_ = (_Head_base<0UL,_duckdb::BaseStatistics_*,_false>)0x0;
                ::std::
                __uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                ::reset(p_Var21,(pointer)uVar9);
                p_Var21 = (__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                           *)vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
                             ::operator[]((vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
                                           *)local_b8._M_head_impl,1);
                uVar9 = local_a8._0_8_;
                local_a8._0_8_ =
                     (__uniq_ptr_data<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true,_true>
                      )0x0;
                ::std::
                __uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                ::reset(p_Var21,(pointer)uVar9);
              }
              uVar9 = local_a8._0_8_;
              if ((BaseStatistics *)local_a8._0_8_ != (BaseStatistics *)0x0) {
                BaseStatistics::~BaseStatistics((BaseStatistics *)local_a8._0_8_);
                operator_delete((void *)uVar9);
              }
              uVar9 = local_108._0_8_;
              if ((LogicalOperator *)local_108._0_8_ != (LogicalOperator *)0x0) {
                BaseStatistics::~BaseStatistics((BaseStatistics *)local_108._0_8_);
                operator_delete((void *)uVar9);
              }
            }
          }
        }
        goto LAB_0175af6c;
      }
      if (((join->super_LogicalJoin).super_LogicalOperator.type != LOGICAL_ASOF_JOIN) ||
         (bVar10 = false, 3 < (byte)(this_02->comparison - COMPARE_LESSTHAN))) {
        if (1 < (ulong)(((long)(join->conditions).
                               super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                               .
                               super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(join->conditions).
                               super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                               .
                               super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555
                       )) {
          vector<duckdb::JoinCondition,_true>::erase_at
                    ((vector<duckdb::JoinCondition,_true> *)local_80._M_nxt,__n);
          puVar3 = &((join->super_LogicalJoin).join_stats.
                     super_vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                    super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
          ;
          puVar4 = &((join->super_LogicalJoin).join_stats.
                     super_vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->
                    super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
          ;
          this_04 = puVar3;
          if (puVar4 != puVar3) {
            do {
              ::std::
              unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
              ~unique_ptr(this_04);
              this_04 = this_04 + 1;
            } while (this_04 != puVar4);
            (join->super_LogicalJoin).join_stats.
            super_vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)puVar3;
          }
          __n = __n - 1;
          bVar10 = false;
          goto LAB_0175af6c;
        }
        switch((join->super_LogicalJoin).super_LogicalOperator.field_0x61) {
        case 3:
          pvVar20 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                    ::operator[](this_00,0);
          local_d0.
          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
          _M_t.
          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
               (pvVar20->
               super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
          (pvVar20->
          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
               (LogicalOperator *)0x0;
          pvVar20 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                    ::operator[](this_00,1);
          local_e0._8_8_ =
               (pvVar20->
               super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
          (pvVar20->
          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
               (LogicalOperator *)0x0;
          LogicalCrossProduct::Create
                    ((LogicalCrossProduct *)local_108,&local_d0,
                     (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                      *)(local_e0 + 8));
          if ((data_t  [8])local_e0._8_8_ != (data_t  [8])0x0) {
            (**(code **)(*(long *)local_e0._8_8_ + 8))();
          }
          local_e0[8] = '\0';
          local_e0[9] = '\0';
          local_e0[10] = '\0';
          local_e0[0xb] = '\0';
          local_e0[0xc] = '\0';
          local_e0[0xd] = '\0';
          local_e0[0xe] = '\0';
          local_e0[0xf] = '\0';
          if ((_Head_base<0UL,_duckdb::NodeStatistics_*,_false>)
              local_d0.
              super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
              ._M_t.
              super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
              .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
              (_Head_base<0UL,_duckdb::NodeStatistics_*,_false>)0x0) {
            (**(code **)(*(long *)local_d0.
                                  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                  ._M_t.
                                  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                                  .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                  _M_head_impl + 8))();
          }
          uVar9 = local_108._0_8_;
          local_d0.
          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
          _M_t.
          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
               (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
                )0x0;
          local_108._0_8_ = (LogicalOperator *)0x0;
          _Var8._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
               *(tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_> *)
                local_e0._0_8_;
          *(undefined8 *)local_e0._0_8_ = uVar9;
          if (_Var8._M_t.
              super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
              .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
              (_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
               )0x0) {
            (**(code **)(*(long *)_Var8._M_t.
                                  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                                  .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                  _M_head_impl + 8))();
            _Var24._M_head_impl = (BaseStatistics *)local_108._0_8_;
            goto LAB_0175af5b;
          }
          break;
        default:
          goto switchD_0175a8cd_caseD_4;
        case 6:
        case 10:
          goto switchD_0175a8cd_caseD_3;
        case 9:
          pvVar20 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                    ::operator[](this_00,0);
          pvVar22 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                    ::operator[](this_00,1);
          _Var5._M_head_impl =
               (pvVar20->
               super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
          (pvVar20->
          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
               (LogicalOperator *)0x0;
          _Var6._M_head_impl =
               (pvVar22->
               super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
          (pvVar22->
          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
               (LogicalOperator *)0x0;
          _Var7._M_head_impl =
               (pvVar20->
               super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
          (pvVar20->
          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = _Var6._M_head_impl
          ;
          if (_Var7._M_head_impl != (LogicalOperator *)0x0) {
            (**(code **)((long)(_Var7._M_head_impl)->_vptr_LogicalOperator + 8))();
          }
          _Var6._M_head_impl =
               (pvVar22->
               super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
          (pvVar22->
          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = _Var5._M_head_impl
          ;
          if (_Var6._M_head_impl != (LogicalOperator *)0x0) {
            (**(code **)((long)(_Var6._M_head_impl)->_vptr_LogicalOperator + 8))();
          }
        case 5:
          BoundLimitNode::ConstantValue((BoundLimitNode *)&local_50,1);
          BoundLimitNode::BoundLimitNode((BoundLimitNode *)&local_70);
          this_03 = (LogicalLimit *)operator_new(0xa8);
          local_108._0_8_ = local_50._M_head_impl;
          local_108._8_8_ = pCStack_48;
          local_f8._M_nxt = local_40;
          _Stack_f0.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
               (_Head_base<0UL,_duckdb::Expression_*,_false>)
               (_Head_base<0UL,_duckdb::Expression_*,_false>)_Stack_38._M_head_impl;
          _Stack_38._M_head_impl = (Expression *)0x0;
          local_a8._16_8_ = local_60;
          _Stack_90._M_head_impl = _Stack_58._M_head_impl;
          local_a8._0_8_ = local_70._M_head_impl;
          local_a8._8_8_ = pCStack_68;
          _Stack_58._M_head_impl = (Expression *)0x0;
          LogicalLimit::LogicalLimit(this_03,(BoundLimitNode *)local_108,(BoundLimitNode *)local_a8)
          ;
          local_110.ptr = (LogicalOperator *)this_03;
          if ((tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
              _Stack_90._M_head_impl != (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
            (*(code *)(*(__node_base_ptr *)&(_Stack_90._M_head_impl)->super_BaseExpression)[1].
                      _M_nxt)();
          }
          _Stack_90._M_head_impl = (Expression *)0x0;
          if (_Stack_f0.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
              (Expression *)0x0) {
            (*(code *)((__node_base_ptr)
                      ((long)*(unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                               *)_Stack_f0.super__Head_base<0UL,_duckdb::Expression_*,_false>.
                                 _M_head_impl + 8))->_M_nxt)();
          }
          if ((_Tuple_impl<0UL,_duckdb::NodeStatistics_*,_std::default_delete<duckdb::NodeStatistics>_>
               )_Stack_58._M_head_impl != (NodeStatistics *)0x0) {
            (*(code *)(*(__node_base_ptr *)_Stack_58._M_head_impl)[1]._M_nxt)();
          }
          if (_Stack_38._M_head_impl != (Expression *)0x0) {
            (**(code **)&((((__uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                             *)&((_Stack_38._M_head_impl)->super_BaseExpression).
                                _vptr_BaseExpression)->_M_t).
                          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)->
                         type)();
          }
          pLVar23 = unique_ptr<duckdb::LogicalLimit,_std::default_delete<duckdb::LogicalLimit>,_true>
                    ::operator->((unique_ptr<duckdb::LogicalLimit,_std::default_delete<duckdb::LogicalLimit>,_true>
                                  *)&local_110);
          LogicalOperator::SetEstimatedCardinality(&pLVar23->super_LogicalOperator,1);
          pLVar23 = unique_ptr<duckdb::LogicalLimit,_std::default_delete<duckdb::LogicalLimit>,_true>
                    ::operator->((unique_ptr<duckdb::LogicalLimit,_std::default_delete<duckdb::LogicalLimit>,_true>
                                  *)&local_110);
          pvVar20 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                    ::operator[](this_00,1);
          local_c0.
          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
          _M_t.
          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
               (pvVar20->
               super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
          (pvVar20->
          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
               (LogicalOperator *)0x0;
          LogicalOperator::AddChild(&pLVar23->super_LogicalOperator,&local_c0);
          if (local_c0.
              super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
              ._M_t.
              super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
              .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
              (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
               )0x0) {
            (**(code **)(*(long *)local_c0.
                                  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                  ._M_t.
                                  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                                  .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                  _M_head_impl + 8))();
          }
          local_c0.
          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
          _M_t.
          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
               (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
                )0x0;
          pvVar20 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                    ::operator[](this_00,0);
          local_c8.
          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
          _M_t.
          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
               local_110.ptr;
          local_b0._M_head_impl =
               (pvVar20->
               super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
          (pvVar20->
          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
               (LogicalOperator *)0x0;
          local_110.ptr = (LogicalOperator *)0x0;
          LogicalCrossProduct::Create
                    ((LogicalCrossProduct *)local_108,
                     (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                      *)&local_b0,&local_c8);
          if (local_c8.
              super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
              ._M_t.
              super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
              .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
              (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
               )0x0) {
            (**(code **)(*(long *)local_c8.
                                  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                  ._M_t.
                                  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                                  .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                  _M_head_impl + 8))();
          }
          local_c8.
          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
          _M_t.
          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
               (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
                )0x0;
          if (local_b0._M_head_impl != (LogicalOperator *)0x0) {
            (*(local_b0._M_head_impl)->_vptr_LogicalOperator[1])();
          }
          uVar9 = local_108._0_8_;
          local_b0._M_head_impl = (LogicalOperator *)0x0;
          local_108._0_8_ = (_Head_base<0UL,_duckdb::BaseStatistics_*,_false>)0x0;
          _Var8._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
               *(tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_> *)
                local_e0._0_8_;
          *(undefined8 *)local_e0._0_8_ = uVar9;
          _Var24._M_head_impl = (BaseStatistics *)local_110.ptr;
          if ((_Var8._M_t.
               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
               (_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                )0x0) &&
             ((**(code **)(*(long *)_Var8._M_t.
                                    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                                    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                    _M_head_impl + 8))(),
             _Var24._M_head_impl = (BaseStatistics *)local_110.ptr,
             (_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
              )local_108._0_8_ != (BaseStatistics *)0x0)) {
            (**(code **)(*(long *)local_108._0_8_ + 8))();
            _Var24._M_head_impl = (BaseStatistics *)local_110.ptr;
          }
LAB_0175af5b:
          if ((LogicalOperator *)_Var24._M_head_impl != (LogicalOperator *)0x0) {
            (*(*(_func_int ***)&((_Var24._M_head_impl)->type).id_)[1])();
          }
        }
        bVar10 = true;
      }
LAB_0175af6c:
      uVar9 = local_120._0_8_;
      if ((Optimizer *)local_120._0_8_ != (Optimizer *)0x0) {
        BaseStatistics::~BaseStatistics((BaseStatistics *)local_120._0_8_);
        operator_delete((void *)uVar9);
      }
      uVar9 = local_120._8_8_;
      if ((ClientContext *)local_120._8_8_ != (ClientContext *)0x0) {
        BaseStatistics::~BaseStatistics((BaseStatistics *)local_120._8_8_);
        operator_delete((void *)uVar9);
      }
    } while ((!bVar10) &&
            (__n = __n + 1,
            __n < (ulong)(((long)(join->conditions).
                                 super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                 .
                                 super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(join->conditions).
                                 super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                 .
                                 super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x5555555555555555)));
  }
  return;
}

Assistant:

void StatisticsPropagator::PropagateStatistics(LogicalComparisonJoin &join, unique_ptr<LogicalOperator> &node_ptr) {
	for (idx_t i = 0; i < join.conditions.size(); i++) {
		auto &condition = join.conditions[i];
		const auto stats_left = PropagateExpression(condition.left);
		const auto stats_right = PropagateExpression(condition.right);
		if (stats_left && stats_right) {
			if ((condition.comparison == ExpressionType::COMPARE_DISTINCT_FROM ||
			     condition.comparison == ExpressionType::COMPARE_NOT_DISTINCT_FROM) &&
			    stats_left->CanHaveNull() && stats_right->CanHaveNull()) {
				// null values are equal in this join, and both sides can have null values
				// nothing to do here
				continue;
			}
			auto prune_result = PropagateComparison(*stats_left, *stats_right, condition.comparison);
			// Add stats to logical_join for perfect hash join
			join.join_stats.push_back(stats_left->ToUnique());
			join.join_stats.push_back(stats_right->ToUnique());
			switch (prune_result) {
			case FilterPropagateResult::FILTER_FALSE_OR_NULL:
			case FilterPropagateResult::FILTER_ALWAYS_FALSE:
				// filter is always false or null, none of the join conditions matter
				switch (join.join_type) {
				case JoinType::RIGHT_SEMI:
				case JoinType::SEMI:
				case JoinType::INNER:
					// semi or inner join on false; entire node can be pruned
					ReplaceWithEmptyResult(node_ptr);
					return;
				case JoinType::RIGHT_ANTI:
				case JoinType::ANTI: {
					if (join.join_type == JoinType::RIGHT_ANTI) {
						std::swap(join.children[0], join.children[1]);
					}
					// If the filter is always false or Null, just return the left child.
					node_ptr = std::move(join.children[0]);
					return;
				}
				case JoinType::LEFT:
					// anti/left outer join: replace right side with empty node
					ReplaceWithEmptyResult(join.children[1]);
					return;
				case JoinType::RIGHT:
					// right outer join: replace left side with empty node
					ReplaceWithEmptyResult(join.children[0]);
					return;
				default:
					// other join types: can't do much meaningful with this information
					// full outer join requires both sides anyway; we can skip the execution of the actual join, but eh
					// mark/single join requires knowing if the rhs has null values or not
					break;
				}
				break;
			case FilterPropagateResult::FILTER_ALWAYS_TRUE:
				// filter is always true
				// If this is the inequality for an AsOf join,
				// then we must leave it in because it also flags
				// the semantics of restricting to a single match
				// so we can't replace it with an equi-join on the remaining conditions.
				if (join.type == LogicalOperatorType::LOGICAL_ASOF_JOIN) {
					switch (condition.comparison) {
					case ExpressionType::COMPARE_GREATERTHAN:
					case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
					case ExpressionType::COMPARE_LESSTHAN:
					case ExpressionType::COMPARE_LESSTHANOREQUALTO:
						continue;
					default:
						break;
					}
				}
				if (join.conditions.size() > 1) {
					// there are multiple conditions: erase this condition
					join.conditions.erase_at(i);
					// remove the corresponding statistics
					join.join_stats.clear();
					i--;
					continue;
				} else {
					// this is the only condition and it is always true: all conditions are true
					switch (join.join_type) {
					case JoinType::RIGHT_SEMI:
					case JoinType::SEMI: {
						if (join.join_type == JoinType::RIGHT_SEMI) {
							std::swap(join.children[0], join.children[1]);
						}
						// when the right child has no data, return an empty set
						// cannot just return the left child because if the right child has no cardinality
						// then the whole result should be empty.
						// TODO: write better CE logic for limits so that we can just look at
						//  join.children[1].estimated_cardinality.
						auto limit = make_uniq<LogicalLimit>(BoundLimitNode::ConstantValue(1), BoundLimitNode());
						limit->SetEstimatedCardinality(1);
						limit->AddChild(std::move(join.children[1]));
						auto cross_product = LogicalCrossProduct::Create(std::move(join.children[0]), std::move(limit));
						node_ptr = std::move(cross_product);
						return;
					}
					case JoinType::INNER: {
						// inner, replace with cross product
						auto cross_product =
						    LogicalCrossProduct::Create(std::move(join.children[0]), std::move(join.children[1]));
						node_ptr = std::move(cross_product);
						return;
					}
					case JoinType::ANTI:
					case JoinType::RIGHT_ANTI: {
						ReplaceWithEmptyResult(node_ptr);
						return;
					}
					default:
						// we don't handle mark/single join here yet
						break;
					}
				}
				break;
			default:
				break;
			}
		}
		// after we have propagated, we can update the statistics on both sides
		// note that it is fine to do this now, even if the same column is used again later
		// e.g. if we have i=j AND i=k, and the stats for j and k are disjoint, we know there are no results
		// so if we have e.g. i: [0, 100], j: [0, 25], k: [75, 100]
		// we can set i: [0, 25] after the first comparison, and statically determine that the second comparison is fals

		// note that we can't update statistics the same for all join types
		// mark and single joins don't filter any tuples -> so there is no propagation possible
		// anti joins have inverse statistics propagation
		// (i.e. if we have an anti join on i: [0, 100] and j: [0, 25], the resulting stats are i:[25,100])
		// for now we don't handle anti joins
		if (condition.comparison == ExpressionType::COMPARE_DISTINCT_FROM ||
		    condition.comparison == ExpressionType::COMPARE_NOT_DISTINCT_FROM) {
			// skip update when null values are equal (for now?)
			continue;
		}
		switch (join.join_type) {
		case JoinType::INNER:
		case JoinType::SEMI: {
			UpdateFilterStatistics(*condition.left, *condition.right, condition.comparison);
			auto updated_stats_left = PropagateExpression(condition.left);
			auto updated_stats_right = PropagateExpression(condition.right);

			// Try to push lhs stats down rhs and vice versa
			if (stats_left && stats_right && updated_stats_left && updated_stats_right &&
			    condition.left->GetExpressionType() == ExpressionType::BOUND_COLUMN_REF &&
			    condition.right->GetExpressionType() == ExpressionType::BOUND_COLUMN_REF) {
				CreateFilterFromJoinStats(join.children[0], condition.left, *stats_left, *updated_stats_left);
				CreateFilterFromJoinStats(join.children[1], condition.right, *stats_right, *updated_stats_right);
			}

			// Update join_stats when is already part of the join
			if (join.join_stats.size() == 2) {
				join.join_stats[0] = std::move(updated_stats_left);
				join.join_stats[1] = std::move(updated_stats_right);
			}
			break;
		}
		default:
			break;
		}
	}
}